

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

int __thiscall Fl_Tabs::tab_height(Fl_Tabs *this)

{
  Fl_Widget *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Widget **ppFVar4;
  int local_5c;
  int local_58;
  Fl_Widget *o;
  Fl_Widget **ppFStack_28;
  int i;
  Fl_Widget **a;
  int H2;
  int H;
  Fl_Tabs *this_local;
  
  iVar1 = Fl_Group::children(&this->super_Fl_Group);
  if (iVar1 == 0) {
    this_local._4_4_ = Fl_Widget::h((Fl_Widget *)this);
  }
  else {
    a._4_4_ = Fl_Widget::h((Fl_Widget *)this);
    a._0_4_ = Fl_Widget::y((Fl_Widget *)this);
    ppFStack_28 = Fl_Group::array(&this->super_Fl_Group);
    o._4_4_ = Fl_Group::children(&this->super_Fl_Group);
    while (iVar1 = o._4_4_ + -1, o._4_4_ != 0) {
      ppFVar4 = ppFStack_28 + 1;
      this_00 = *ppFStack_28;
      iVar2 = Fl_Widget::y(this_00);
      iVar3 = Fl_Widget::y((Fl_Widget *)this);
      if (iVar2 < iVar3 + a._4_4_) {
        iVar2 = Fl_Widget::y(this_00);
        iVar3 = Fl_Widget::y((Fl_Widget *)this);
        a._4_4_ = iVar2 - iVar3;
      }
      iVar2 = Fl_Widget::y(this_00);
      iVar3 = Fl_Widget::h(this_00);
      o._4_4_ = iVar1;
      ppFStack_28 = ppFVar4;
      if ((int)a < iVar2 + iVar3) {
        iVar1 = Fl_Widget::y(this_00);
        iVar2 = Fl_Widget::h(this_00);
        a._0_4_ = iVar1 + iVar2;
      }
    }
    iVar1 = Fl_Widget::y((Fl_Widget *)this);
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    local_58 = (iVar1 + iVar2) - (int)a;
    if (a._4_4_ < local_58) {
      if (local_58 < 1) {
        local_58 = 0;
      }
      else {
        local_58 = -local_58;
      }
      this_local._4_4_ = local_58;
    }
    else {
      if (a._4_4_ < 1) {
        local_5c = 0;
      }
      else {
        local_5c = a._4_4_;
      }
      this_local._4_4_ = local_5c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tabs::tab_height() {
  if (children() == 0) return h();
  int H = h();
  int H2 = y();
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (o->y() < y()+H) H = o->y()-y();
    if (o->y()+o->h() > H2) H2 = o->y()+o->h();
  }
  H2 = y()+h()-H2;
  if (H2 > H) return (H2 <= 0) ? 0 : -H2;
  else return (H <= 0) ? 0 : H;
}